

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRef.hpp
# Opt level: O0

void __thiscall BCL::GlobalRef<int>::GlobalRef(GlobalRef<int> *this,GlobalPtr<int> ptr)

{
  bool bVar1;
  debug_error *this_00;
  allocator<char> local_41;
  string local_40;
  GlobalRef<int> *local_20;
  GlobalRef<int> *this_local;
  GlobalPtr<int> ptr_local;
  
  ptr_local.rank = ptr.ptr;
  this_local = (GlobalRef<int> *)ptr.rank;
  (this->ptr_).rank = (size_t)this_local;
  (this->ptr_).ptr = ptr_local.rank;
  local_20 = this;
  bVar1 = GlobalPtr<int>::operator==(&this->ptr_,(nullptr_t)0x0);
  if (!bVar1) {
    return;
  }
  this_00 = (debug_error *)__cxa_allocate_exception(0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GlobalRef() constructor created a null reference.",&local_41);
  debug_error::debug_error(this_00,&local_40);
  __cxa_throw(this_00,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

GlobalRef(BCL::GlobalPtr<T> ptr) : ptr_(ptr) {
    BCL_DEBUG(
      if (ptr_ == nullptr) {
        throw debug_error("GlobalRef() constructor created a null reference.");
      }
    )
  }